

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glist_checkanddeselectall(_glist *gl,t_gobj *g)

{
  t_pd local_28;
  t_gobj *g2;
  _glist *gl2;
  t_gobj *g_local;
  _glist *gl_local;
  
  if (g->g_pd == canvas_class) {
    for (local_28 = g[3].g_pd; local_28 != (t_pd)0x0; local_28 = (t_pd)local_28->c_helpname) {
      glist_checkanddeselectall((_glist *)g,(t_gobj *)local_28);
    }
    glist_noselect((_glist *)g);
  }
  return;
}

Assistant:

static void glist_checkanddeselectall(t_glist *gl, t_gobj *g)
{
    t_glist *gl2;
    t_gobj *g2;
    if (pd_class(&g->g_pd) != canvas_class)
        return;
    gl2 = (t_glist *)g;
    for (g2 = gl2->gl_list; g2; g2 = g2->g_next)
        glist_checkanddeselectall(gl2, g2);
    glist_noselect(gl2);
}